

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processTypeDefinitionRef
          (PSVIWriterHandlers *this,XMLCh *enclose,XSTypeDefinition *type)

{
  TYPE_CATEGORY TVar1;
  XSTypeDefinition *type_local;
  XMLCh *enclose_local;
  PSVIWriterHandlers *this_local;
  
  if (type == (XSTypeDefinition *)0x0) {
    sendElementEmpty(this,enclose);
  }
  else {
    sendIndentedElement(this,enclose);
    TVar1 = xercesc_4_0::XSTypeDefinition::getTypeCategory(type);
    if (TVar1 == SIMPLE_TYPE) {
      sendReference(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition,(XSObject *)type);
    }
    else {
      sendReference(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgComplexTypeDefinition,(XSObject *)type);
    }
    sendUnindentedElement(this,enclose);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processTypeDefinitionRef(const XMLCh* enclose, XSTypeDefinition* type) {
	if (type==NULL) {
		sendElementEmpty(enclose);
	} else {
		sendIndentedElement(enclose);
		if (type->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE) {
			sendReference(PSVIUni::fgSimpleTypeDefinition, type);
		} else {
			sendReference(PSVIUni::fgComplexTypeDefinition, type);
		}
		sendUnindentedElement(enclose);
	}
}